

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_str2int(char *str,size_t len,int64_t *res)

{
  long lVar1;
  long *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  int64_t prev;
  size_t i;
  int64_t tmp;
  int sign;
  ulong local_38;
  long local_30;
  int local_24;
  size_t local_18;
  char *local_10;
  int local_4;
  
  *in_RDX = 0;
  local_18 = in_RSI;
  if (in_RSI == 0) {
    local_18 = strlen(in_RDI);
  }
  if (local_18 == 0) {
    local_4 = 0;
  }
  else {
    local_24 = 1;
    local_10 = in_RDI;
    if (*in_RDI == '-') {
      local_24 = -1;
      local_18 = local_18 - 1;
      local_10 = in_RDI + 1;
    }
    local_30 = 0;
    for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
      if ((local_10[local_38] < '0') || ('9' < local_10[local_38])) {
        return 0;
      }
      lVar1 = (long)(local_10[local_38] + -0x30) + local_30 * 10;
      if (lVar1 <= local_30) {
        return 1;
      }
      local_30 = lVar1;
    }
    *in_RDX = local_24 * local_30;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

MCPL_LOCAL int mcpl_str2int(const char* str, size_t len, int64_t* res)
{
  //portable 64bit str2int with error checking (only INT64_MIN might not be
  //possible to specify).
  *res = 0;
  if (!len)
    len=strlen(str);
  if (!len)
    return 0;
  int sign = 1;
  if (str[0]=='-') {
    sign = -1;
    len -= 1;
    str += 1;
  }
  int64_t tmp = 0;
  size_t i;
  for (i=0; i<len; ++i) {
    if (str[i]<'0'||str[i]>'9') {
      return 0;
    }
    int64_t prev = tmp;
    tmp *= 10;
    tmp += str[i] - '0';
    if (prev>=tmp)
      return 1;//overflow (hopefully it did not trigger a signal or FPE)
  }
  *res = sign * tmp;
  return 1;
}